

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgram.cpp
# Opt level: O1

int __thiscall zmq::dgram_t::xsend(dgram_t *this,msg_t *msg_)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int *piVar4;
  ssize_t sVar5;
  size_t in_RCX;
  void *__buf;
  EVP_PKEY_CTX *ctx;
  
  if (this->_pipe == (pipe_t *)0x0) {
    iVar3 = msg_t::close(msg_,(int)msg_);
    if (iVar3 != 0) {
      xsend();
      return -1;
    }
    return -1;
  }
  bVar1 = this->_more_out;
  bVar2 = msg_t::flags(msg_);
  if (bVar1 == false) {
    if ((bVar2 & 1) == 0) goto LAB_001ed714;
  }
  else if ((bVar2 & 1) != 0) {
LAB_001ed714:
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    return -1;
  }
  ctx = (EVP_PKEY_CTX *)msg_;
  sVar5 = pipe_t::write(this->_pipe,(int)msg_,__buf,in_RCX);
  if ((char)sVar5 == '\0') {
    piVar4 = __errno_location();
    *piVar4 = 0xb;
    return -1;
  }
  bVar2 = msg_t::flags(msg_);
  if ((bVar2 & 1) == 0) {
    pipe_t::flush(this->_pipe);
  }
  this->_more_out = (bool)(this->_more_out ^ 1);
  iVar3 = msg_t::init(msg_,ctx);
  if (iVar3 != 0) {
    xsend();
    return 0;
  }
  return 0;
}

Assistant:

int zmq::dgram_t::xsend (msg_t *msg_)
{
    // If there's no out pipe, just drop it.
    if (!_pipe) {
        const int rc = msg_->close ();
        errno_assert (rc == 0);
        return -1;
    }

    //  If this is the first part of the message it's the ID of the
    //  peer to send the message to.
    if (!_more_out) {
        if (!(msg_->flags () & msg_t::more)) {
            errno = EINVAL;
            return -1;
        }
    } else {
        //  dgram messages are two part only, reject part if more is set
        if (msg_->flags () & msg_t::more) {
            errno = EINVAL;
            return -1;
        }
    }

    // Push the message into the pipe.
    if (!_pipe->write (msg_)) {
        errno = EAGAIN;
        return -1;
    }

    if (!(msg_->flags () & msg_t::more))
        _pipe->flush ();

    // flip the more flag
    _more_out = !_more_out;

    //  Detach the message from the data buffer.
    const int rc = msg_->init ();
    errno_assert (rc == 0);

    return 0;
}